

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

ProgramHeaders * __thiscall pstack::Elf::Object::getSegments(Object *this,Word type)

{
  int iVar1;
  const_iterator cVar2;
  ProgramHeaders *pPVar3;
  Word local_1c [2];
  Word type_local;
  
  local_1c[0] = type;
  cVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
          ::find(&(this->programHeaders)._M_t,local_1c);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->programHeaders)._M_t._M_impl.super__Rb_tree_header
     ) {
    pPVar3 = &getSegments::empty;
    if (getSegments(unsigned_int)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&getSegments(unsigned_int)::empty);
      if (iVar1 != 0) {
        getSegments::empty.super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        getSegments::empty.super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        getSegments::empty.super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar3 = &getSegments::empty;
        __cxa_atexit(std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::~vector,
                     &getSegments::empty,&__dso_handle);
        __cxa_guard_release(&getSegments(unsigned_int)::empty);
      }
    }
  }
  else {
    pPVar3 = (ProgramHeaders *)&cVar2._M_node[1]._M_parent;
  }
  return (ProgramHeaders *)(_Base_ptr *)pPVar3;
}

Assistant:

const Object::ProgramHeaders &
Object::getSegments(Word type) const
{
    auto it = programHeaders.find(type);
    if (it == programHeaders.end()) {
        static const ProgramHeaders empty;
        return empty;
    }
    return it->second;
}